

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O2

bool __thiscall
anurbs::RTree<3L>::PickByBox::operator()(PickByBox *this,Vector *box_min,Vector *box_max)

{
  double dVar1;
  ulong uVar2;
  CoeffReturnType pdVar3;
  ulong index;
  
  uVar2 = 0;
  do {
    index = uVar2;
    if (index == 3) break;
    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)&this->m_box_max
                        ,index);
    dVar1 = *pdVar3;
    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)box_min,index);
    if (dVar1 < *pdVar3) break;
    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)this,index);
    dVar1 = *pdVar3;
    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)box_max,index);
    uVar2 = index + 1;
  } while (dVar1 < *pdVar3 || dVar1 == *pdVar3);
  return 2 < index;
}

Assistant:

bool operator()(const Vector box_min, const Vector box_max) const noexcept
        {
            for (Index i = 0; i < TDimension; i++) {
                if (m_box_max[i] < box_min[i]) {
                    return false;
                }
                if (m_box_min[i] > box_max[i]) {
                    return false;
                }
            }
            return true;
        }